

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O0

bool __thiscall
SharedMemRingBuffer::RegisterConsumer(SharedMemRingBuffer *this,int id,int64_t *index_for_customer)

{
  __int_type _Var1;
  __int_type_conflict _Var2;
  __int_type_conflict *in_RDX;
  __atomic_base<long> *in_RDI;
  memory_order __b;
  undefined4 in_stack_ffffffffffffffb8;
  memory_order in_stack_ffffffffffffffbc;
  
  _Var2 = std::__atomic_base::operator_cast_to_long
                    ((__atomic_base<long> *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (_Var2 == -1) {
    std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RDI[0x1b]._M_i + 0xc),0);
    _Var1 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (199 < _Var1) {
      return false;
    }
    _Var2 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (_Var2 < 0) {
      std::__atomic_base<long>::operator=
                (in_RDI,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    else {
      in_stack_ffffffffffffffbc = std::operator&(memory_order_seq_cst,__memory_order_mask);
      std::__atomic_base<long>::operator=
                (in_RDI,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    }
    _Var2 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    *in_RDX = _Var2;
  }
  else {
    _Var2 = std::__atomic_base::operator_cast_to_long
                      ((__atomic_base<long> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    *in_RDX = _Var2 + 1;
  }
  return true;
}

Assistant:

bool SharedMemRingBuffer::RegisterConsumer (int id, int64_t* index_for_customer)
{
    if(ring_buffer_status_on_shared_mem_->array_consumer_indexes[id] == -1 ) {
        //처음 등록 
        ring_buffer_status_on_shared_mem_->registered_consumer_count++;
        if( ring_buffer_status_on_shared_mem_->registered_consumer_count >= MAX_CONSUMER) {
            DEBUG_ELOG("Error: Exceeds MAX_CONSUMER : " << MAX_CONSUMER); 
            return false;
        }

        if(ring_buffer_status_on_shared_mem_->cursor >= 0 ) {
            DEBUG_LOG("cursor >= 0"); 
            //데이터 전달 중이데 새로운 소비자가 추가
            ring_buffer_status_on_shared_mem_->array_consumer_indexes[id] = 
                ring_buffer_status_on_shared_mem_->cursor.load() ; 
        } else {
            DEBUG_LOG("set 0 "); 
            ring_buffer_status_on_shared_mem_->array_consumer_indexes[id] = 0; 
        }

        *index_for_customer = ring_buffer_status_on_shared_mem_->array_consumer_indexes[id];
    } else {
        //last read message index 
        //기존 최종 업데이트 했던 인덱스 + 1 돌려준다. consumer가 호출할 인덱스 이므로 ..
        *index_for_customer = ring_buffer_status_on_shared_mem_->array_consumer_indexes[id] + 1;
    }
    DEBUG_LOG("USAGE_CONSUMER ID : " << id<< " / index : "<< *index_for_customer); 
    return true;
}